

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::DumbDirectoryDatabase::get_hash_list_for_resource_tag
          (DumbDirectoryDatabase *this,ResourceTag tag,size_t *hash_count,Hash *hashes)

{
  size_t sVar1;
  __node_base *p_Var2;
  Hash *pHVar3;
  
  sVar1 = this->seen_blobs[tag]._M_h._M_element_count;
  if (hashes == (Hash *)0x0) {
    *hash_count = sVar1;
    return true;
  }
  if (sVar1 == *hash_count) {
    p_Var2 = &this->seen_blobs[tag]._M_h._M_before_begin;
    pHVar3 = hashes;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      *pHVar3 = (Hash)p_Var2[1]._M_nxt;
      pHVar3 = pHVar3 + 1;
    }
    std::__sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(hashes,hashes + sVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_hash_list_for_resource_tag(ResourceTag tag, size_t *hash_count, Hash *hashes) override
	{
		size_t size = seen_blobs[tag].size();
		if (hashes)
		{
			if (size != *hash_count)
				return false;
		}
		else
			*hash_count = size;

		if (hashes)
		{
			Hash *iter = hashes;
			for (auto &blob : seen_blobs[tag])
				*iter++ = blob;

			// Make replay more deterministic.
			sort(hashes, hashes + size);
		}
		return true;
	}